

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

saint_t sufcheck64(sauchar_t *T,saidx64_t *SA,saidx64_t n,saint_t verbose)

{
  long lVar1;
  byte extraout_AL;
  long lVar2;
  long lVar3;
  saidx64_t sVar4;
  long lVar5;
  saint_t sVar6;
  byte bVar7;
  ulong uVar8;
  byte bVar9;
  long lVar10;
  saidx64_t C [256];
  
  if (verbose == 0) {
    if (n < 0 || (SA == (saidx64_t *)0x0 || T == (sauchar_t *)0x0)) {
      return -1;
    }
    if (n == 0) {
      return 0;
    }
  }
  else {
    sufcheck64_cold_1();
    if ((extraout_AL & 1) != 0) {
      return (saint_t)C[0];
    }
  }
  lVar3 = 0;
  do {
    if ((ulong)n <= (ulong)SA[lVar3]) {
      if (verbose == 0) {
        return -2;
      }
      fprintf(_stderr,"Out of the range [0,%ld].\n  SA[%ld]=%ld\n",n + -1);
      return -2;
    }
    lVar3 = lVar3 + 1;
  } while (n != lVar3);
  if (n < 2) {
LAB_00106975:
    lVar3 = 0;
    memset(C,0,0x800);
    do {
      C[T[lVar3]] = C[T[lVar3]] + 1;
      lVar3 = lVar3 + 1;
    } while (n != lVar3);
    lVar2 = 0;
    lVar3 = 0;
    do {
      lVar10 = C[lVar2];
      C[lVar2] = lVar3;
      lVar2 = lVar2 + 1;
      lVar3 = lVar10 + lVar3;
    } while (lVar2 != 0x100);
    bVar7 = T[n + -1];
    lVar3 = C[bVar7];
    C[bVar7] = lVar3 + 1;
    lVar2 = 0;
    do {
      lVar1 = SA[lVar2];
      uVar8 = (ulong)bVar7;
      lVar5 = lVar3;
      lVar10 = n + -1;
      if (0 < lVar1) {
        lVar10 = lVar1 + -1;
        uVar8 = (ulong)T[lVar1 + -1];
        lVar5 = C[uVar8];
      }
      if ((lVar5 < 0) || (lVar10 != SA[lVar5])) {
        if (verbose == 0) {
          return -4;
        }
        sVar4 = -1;
        if (-1 < lVar5) {
          sVar4 = SA[lVar5];
        }
        fprintf(_stderr,"Suffix in wrong position.\n  SA[%ld]=%ld or\n  SA[%ld]=%ld\n",lVar5,sVar4);
        return -4;
      }
      if (lVar5 != lVar3) {
        lVar1 = C[uVar8];
        lVar10 = lVar1 + 1;
        C[uVar8] = lVar10;
        if ((n <= lVar10) || (T[SA[lVar1 + 1]] != (sauchar_t)uVar8)) {
          C[uVar8] = -1;
        }
      }
      lVar2 = lVar2 + 1;
    } while (n != lVar2);
    sVar6 = 0;
    if (0 < verbose) {
      sufcheck64_cold_2();
      sVar6 = 0;
    }
  }
  else {
    lVar3 = *SA;
    lVar2 = SA[1];
    bVar7 = T[lVar3];
    bVar9 = T[lVar2];
    lVar10 = 1;
    if (bVar7 <= bVar9) {
      do {
        bVar7 = bVar9;
        lVar3 = lVar2;
        if ((2 - n) + lVar10 == 1) goto LAB_00106975;
        lVar2 = SA[lVar10 + 1];
        bVar9 = T[lVar2];
        lVar10 = lVar10 + 1;
      } while (bVar7 <= bVar9);
    }
    sVar6 = -3;
    if (verbose != 0) {
      fprintf(_stderr,"Suffixes in wrong order.\n  T[SA[%ld]=%ld]=%d > T[SA[%ld]=%ld]=%d\n",
              lVar10 + -1,lVar3,(ulong)bVar7,lVar10,lVar2,(ulong)bVar9);
    }
  }
  return sVar6;
}

Assistant:

saint_t
sufcheck(const sauchar_t *T, const saidx_t *SA,
         saidx_t n, saint_t verbose) {
  saidx_t C[ALPHABET_SIZE];
  saidx_t i, p, q, t;
  saint_t c;

  if(verbose) { fprintf(stderr, "sufcheck: "); }

  /* Check arguments. */
  if((T == NULL) || (SA == NULL) || (n < 0)) {
    if(verbose) { fprintf(stderr, "Invalid arguments.\n"); }
    return -1;
  }
  if(n == 0) {
    if(verbose) { fprintf(stderr, "Done.\n"); }
    return 0;
  }

  /* check range: [0..n-1] */
  for(i = 0; i < n; ++i) {
    if((SA[i] < 0) || (n <= SA[i])) {
      if(verbose) {
        fprintf(stderr, "Out of the range [0,%" PRIdSAIDX_T "].\n"
                        "  SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "\n",
                        n - 1, i, SA[i]);
      }
      return -2;
    }
  }

  /* check first characters. */
  for(i = 1; i < n; ++i) {
    if(T[SA[i - 1]] > T[SA[i]]) {
      if(verbose) {
        fprintf(stderr, "Suffixes in wrong order.\n"
                        "  T[SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "]=%d"
                        " > T[SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "]=%d\n",
                        i - 1, SA[i - 1], T[SA[i - 1]], i, SA[i], T[SA[i]]);
      }
      return -3;
    }
  }

  /* check suffixes. */
  for(i = 0; i < ALPHABET_SIZE; ++i) { C[i] = 0; }
  for(i = 0; i < n; ++i) { ++C[T[i]]; }
  for(i = 0, p = 0; i < ALPHABET_SIZE; ++i) {
    t = C[i];
    C[i] = p;
    p += t;
  }

  q = C[T[n - 1]];
  C[T[n - 1]] += 1;
  for(i = 0; i < n; ++i) {
    p = SA[i];
    if(0 < p) {
      c = T[--p];
      t = C[c];
    } else {
      c = T[p = n - 1];
      t = q;
    }
    if((t < 0) || (p != SA[t])) {
      if(verbose) {
        fprintf(stderr, "Suffix in wrong position.\n"
                        "  SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T " or\n"
                        "  SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "\n",
                        t, (0 <= t) ? SA[t] : -1, i, SA[i]);
      }
      return -4;
    }
    if(t != q) {
      ++C[c];
      if((n <= C[c]) || (T[SA[C[c]]] != c)) { C[c] = -1; }
    }
  }

  if(1 <= verbose) { fprintf(stderr, "Done.\n"); }
  return 0;
}